

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O2

QSet<QGesture_*> __thiscall
QSet<QGesture_*>::intersected_helper
          (QSet<QGesture_*> *this,QSet<QGesture_*> *lhs,QSet<QGesture_*> *rhs)

{
  Data *pDVar1;
  Span *pSVar2;
  bool bVar3;
  ulong uVar4;
  size_t size;
  size_t sVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  const_iterator cVar7;
  QSet<QGesture_*> local_50 [2];
  piter local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->q_hash).d = (Data *)0x0;
  pDVar1 = (lhs->q_hash).d;
  if (pDVar1 == (Data *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = pDVar1->size;
  }
  pDVar1 = (rhs->q_hash).d;
  if (pDVar1 == (Data *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = pDVar1->size;
  }
  size = sVar5;
  if ((long)sVar6 < (long)sVar5) {
    size = sVar6;
  }
  QHash<QGesture_*,_QHashDummyValue>::reserve(&this->q_hash,size);
  if ((long)sVar6 < (long)sVar5) {
    local_40 = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&rhs->q_hash);
    while( true ) {
      if (local_40.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
          local_40.bucket == 0) break;
      pSVar2 = (local_40.d)->spans;
      uVar4 = local_40.bucket >> 7;
      cVar7 = QHash<QGesture*,QHashDummyValue>::constFindImpl<QGesture*>
                        ((QHash<QGesture*,QHashDummyValue> *)lhs,
                         (QGesture **)
                         (pSVar2[uVar4].entries +
                         pSVar2[uVar4].offsets[(uint)local_40.bucket & 0x7f]));
      if (cVar7.i.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 ||
          cVar7.i.bucket != 0) {
        insert(local_50,(QGesture **)this);
      }
      QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                (&local_40);
    }
  }
  else {
    local_40 = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&lhs->q_hash);
    while( true ) {
      if (local_40.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
          local_40.bucket == 0) break;
      pSVar2 = (local_40.d)->spans;
      uVar4 = local_40.bucket >> 7;
      bVar3 = QHash<QGesture_*,_QHashDummyValue>::contains
                        (&rhs->q_hash,
                         (QGesture **)
                         (pSVar2[uVar4].entries +
                         pSVar2[uVar4].offsets[(uint)local_40.bucket & 0x7f]));
      if (bVar3) {
        insert(local_50,(QGesture **)this);
      }
      QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                (&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSet<QGesture_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

auto QSet<T>::intersected_helper(const QSet &lhs, const QSet &rhs) -> QSet
{
    QSet r;

    const auto l_size = lhs.size();
    const auto r_size = rhs.size();
    r.reserve((std::min)(l_size, r_size));

    // Iterate the smaller of the two sets, but always take from lhs, for
    // consistency with insert():

    if (l_size <= r_size) {
        // lhs is not larger
        for (const auto &e : lhs) {
            if (rhs.contains(e))
                r.insert(e);
        }
    } else {
        // rhs is smaller
        for (const auto &e : rhs) {
            if (const auto it = lhs.find(e); it != lhs.end())
                r.insert(*it);
        }
    }

    return r;
}